

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_robarm.cpp
# Opt level: O1

bool __thiscall EnvironmentROBARM::InitializeEnvironment(EnvironmentROBARM *this)

{
  pointer ppEVar1;
  int iVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar5;
  undefined1 auVar6 [16];
  unsigned_short endeffy;
  unsigned_short endeffx;
  unsigned_short coord [6];
  double startangles [6];
  double angles [6];
  ushort local_9c;
  ushort local_9a;
  undefined8 local_98;
  undefined4 local_90;
  double local_88 [6];
  undefined1 local_58 [48];
  
  (this->EnvROBARM).HashTableSize = 0x8000;
  puVar3 = (undefined8 *)operator_new__(0xc0008);
  *puVar3 = 0x8000;
  memset((vector<ENVROBARMHASHENTRY_*,_std::allocator<ENVROBARMHASHENTRY_*>_> *)(puVar3 + 1),0,
         0xc0000);
  (this->EnvROBARM).Coord2StateIDHashTable =
       (vector<ENVROBARMHASHENTRY_*,_std::allocator<ENVROBARMHASHENTRY_*>_> *)(puVar3 + 1);
  ppEVar1 = (this->EnvROBARM).StateID2CoordTable.
            super__Vector_base<ENVROBARMHASHENTRY_*,_std::allocator<ENVROBARMHASHENTRY_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->EnvROBARM).StateID2CoordTable.
      super__Vector_base<ENVROBARMHASHENTRY_*,_std::allocator<ENVROBARMHASHENTRY_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar1) {
    (this->EnvROBARM).StateID2CoordTable.
    super__Vector_base<ENVROBARMHASHENTRY_*,_std::allocator<ENVROBARMHASHENTRY_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar1;
  }
  lVar4 = 0;
  do {
    auVar6 = divpd(*(undefined1 (*) [16])((this->EnvROBARMCfg).LinkStartAngles_d + lVar4),
                   ram0x00148470);
    local_88[lVar4] = auVar6._0_8_ * 3.141592653589793;
    local_88[lVar4 + 1] = auVar6._8_8_ * 3.141592653589793;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 6);
  (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x1d])
            (this,local_88,&local_98);
  (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x1c])
            (this,&local_98,local_58);
  (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x1e])
            (this,local_58,&local_9a,&local_9c);
  iVar2 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x33])
                    (this,&local_98,6,(ulong)local_9a,(ulong)local_9c);
  (this->EnvROBARM).startHashEntry = (EnvROBARMHashEntry_t *)CONCAT44(extraout_var,iVar2);
  local_98 = 0;
  local_90 = 0;
  iVar2 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x33])
                    (this,&local_98,6,(ulong)(this->EnvROBARMCfg).EndEffGoalX_c,
                     (ulong)(this->EnvROBARMCfg).EndEffGoalY_c);
  (this->EnvROBARM).goalHashEntry = (EnvROBARMHashEntry_t *)CONCAT44(extraout_var_00,iVar2);
  bVar5 = false;
  iVar2 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x1f])
                    (this,((this->EnvROBARM).startHashEntry)->coord,0,0);
  if (iVar2 != 0) {
    if (((int)(uint)(this->EnvROBARMCfg).EndEffGoalX_c < (this->EnvROBARMCfg).EnvWidth_c) &&
       ((int)(uint)(this->EnvROBARMCfg).EndEffGoalY_c < (this->EnvROBARMCfg).EnvHeight_c)) {
      (this->EnvROBARM).Heur = (int **)0x0;
      bVar5 = true;
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool EnvironmentROBARM::InitializeEnvironment()
{
    short unsigned int coord[NUMOFLINKS];
    double startangles[NUMOFLINKS];
    double angles[NUMOFLINKS];
    int i;
    short unsigned int endeffx, endeffy;

    //initialize the map from Coord to StateID
    EnvROBARM.HashTableSize = 32 * 1024; //should be power of two
    EnvROBARM.Coord2StateIDHashTable = new vector<EnvROBARMHashEntry_t*> [EnvROBARM.HashTableSize];

    //initialize the map from StateID to Coord
    EnvROBARM.StateID2CoordTable.clear();

    //initialize the angles of the start states
    for (i = 0; i < NUMOFLINKS; i++) {
        startangles[i] = PI_CONST * (EnvROBARMCfg.LinkStartAngles_d[i] / 180.0);
    }

    ComputeCoord(startangles, coord);
    ComputeContAngles(coord, angles);
    ComputeEndEffectorPos(angles, &endeffx, &endeffy);

    //create the start state
    EnvROBARM.startHashEntry = CreateNewHashEntry(coord, NUMOFLINKS, endeffx, endeffy);

    //create the goal state
    //initialize the coord of goal state
    for (i = 0; i < NUMOFLINKS; i++) {
        coord[i] = 0;
    }
    EnvROBARM.goalHashEntry = CreateNewHashEntry(coord, NUMOFLINKS, EnvROBARMCfg.EndEffGoalX_c,
                                                 EnvROBARMCfg.EndEffGoalY_c);

    //check the validity of both goal and start configurations
    //testing for EnvROBARMCfg.EndEffGoalX_c < 0  and EnvROBARMCfg.EndEffGoalY_c < 0 is useless since they are unsigned
    if (!IsValidCoord(EnvROBARM.startHashEntry->coord) || EnvROBARMCfg.EndEffGoalX_c >= EnvROBARMCfg.EnvWidth_c
        || EnvROBARMCfg.EndEffGoalY_c >= EnvROBARMCfg.EnvHeight_c) {
        SBPL_PRINTF("Either start or goal configuration is invalid\n");
        return false;
    }

    //for now heuristics are not set
    EnvROBARM.Heur = NULL;

    return true;
}